

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astDownCastNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t type;
  undefined1 auStack_a8 [7];
  _Bool hasLiteralType;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_48_6_e9b21cd0 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x30);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar2);
  gcFrameRecord.roots[3] = sVar3;
  _auStack_a8 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
  sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                    (context,gcFrameRecord.roots[5],(context->roots).typeType,*psVar2);
  gcFrameRecord.roots[5] = sVar3;
  _Var1 = sysbvm_astNode_isLiteralNode(context,sVar3);
  if (_Var1) {
    gcFrame.typeExpressionType = sysbvm_astLiteralNode_getValue(sVar3);
  }
  else {
    sVar3 = sysbvm_astNode_getAnalyzedType(sVar3);
    gcFrame.typeExpressionType = sysbvm_type_getCanonicalPendingInstanceType(context,sVar3);
  }
  sVar3 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                    (context,gcFrameRecord.roots[6],*psVar2);
  gcFrameRecord.roots[6] = sVar3;
  if (gcFrame.typeExpressionType == 0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:835: assertion failure: gcFrame.type"
              );
  }
  gcFrameRecord.roots[4] = gcFrame.typeExpressionType;
  if (_Var1) {
    type = sysbvm_astNode_getAnalyzedType(sVar3);
    _Var1 = sysbvm_type_isDirectSubtypeOf(type,gcFrame.typeExpressionType);
    if (_Var1) {
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      return sVar3;
    }
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDownCastNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astDownCastNode_t *downCastNode;
        sysbvm_tuple_t typeExpression;
        sysbvm_tuple_t typeExpressionType;
        sysbvm_tuple_t type;

        sysbvm_tuple_t valueExpression;
        sysbvm_tuple_t valueExpressionType;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.downCastNode = (sysbvm_astDownCastNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.downCastNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.downCastNode->super.sourcePosition);

    gcFrame.typeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.downCastNode->typeExpression, context->roots.typeType, *environment);
    gcFrame.downCastNode->typeExpression = gcFrame.typeExpression;
    bool hasLiteralType = sysbvm_astNode_isLiteralNode(context, gcFrame.typeExpression);
    if(hasLiteralType)
    {
        gcFrame.type = sysbvm_astLiteralNode_getValue(gcFrame.typeExpression);
    }
    else
    {
        gcFrame.typeExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.typeExpression);
        gcFrame.type = sysbvm_type_getCanonicalPendingInstanceType(context, gcFrame.typeExpressionType);
    }

    gcFrame.valueExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.downCastNode->valueExpression, *environment);
    gcFrame.downCastNode->valueExpression = gcFrame.valueExpression;
    SYSBVM_ASSERT(gcFrame.type);
    gcFrame.downCastNode->super.analyzedType = gcFrame.type;

    // Is this already a value with the expected type?
    if(hasLiteralType)
    {
        gcFrame.valueExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.valueExpression);
        if(sysbvm_type_isDirectSubtypeOf(gcFrame.valueExpressionType, gcFrame.type))
        {
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return (sysbvm_tuple_t)gcFrame.valueExpression;
        }
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.downCastNode;
}